

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

BlockEntry * __thiscall mkvparser::Cluster::GetEntry(Cluster *this,CuePoint *cp,TrackPosition *tp)

{
  long lVar1;
  BlockEntry *pBVar2;
  Tracks *this_00;
  int iVar3;
  long lVar4;
  Block *pBVar5;
  longlong lVar6;
  BlockEntry **ppBVar7;
  undefined4 extraout_var_00;
  Track *pTVar8;
  long lVar9;
  long len;
  longlong pos;
  long local_40;
  longlong local_38;
  undefined4 extraout_var;
  
  if (this->m_pSegment == (Segment *)0x0) {
    __assert_fail("m_pSegment",
                  "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                  ,0x1d50,
                  "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                 );
  }
  lVar1 = cp->m_timecode;
  lVar9 = tp->m_block;
  if (0 < lVar9) {
    while (this->m_entries_count < lVar9) {
      lVar4 = Parse(this,&local_38,&local_40);
      if (lVar4 < 0) {
        return (BlockEntry *)0x0;
      }
      if (lVar4 != 0) {
        return (BlockEntry *)0x0;
      }
    }
    pBVar2 = this->m_entries[lVar9 + -1];
    if (pBVar2 == (BlockEntry *)0x0) {
      __assert_fail("pEntry",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d65,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                   );
    }
    iVar3 = (*pBVar2->_vptr_BlockEntry[3])(pBVar2);
    if (iVar3 == 0) {
      __assert_fail("!pEntry->EOS()",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d66,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                   );
    }
    iVar3 = (*pBVar2->_vptr_BlockEntry[2])(pBVar2);
    pBVar5 = (Block *)CONCAT44(extraout_var,iVar3);
    if (pBVar5 == (Block *)0x0) {
      __assert_fail("pBlock",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d69,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                   );
    }
    if ((pBVar5->m_track == tp->m_track) &&
       (lVar6 = Block::GetTimeCode(pBVar5,this), lVar6 == lVar1)) {
      return pBVar2;
    }
  }
  lVar9 = 0;
  while( true ) {
    if (lVar9 < this->m_entries_count) {
      ppBVar7 = this->m_entries;
    }
    else {
      lVar4 = Parse(this,&local_38,&local_40);
      if (lVar4 != 0) {
        return (BlockEntry *)0x0;
      }
      ppBVar7 = this->m_entries;
      if (ppBVar7 == (BlockEntry **)0x0) {
        __assert_fail("m_entries",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d80,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                     );
      }
      if (this->m_entries_count <= lVar9) {
        __assert_fail("index < m_entries_count",
                      "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                      ,0x1d81,
                      "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                     );
      }
    }
    pBVar2 = ppBVar7[lVar9];
    if (pBVar2 == (BlockEntry *)0x0) {
      __assert_fail("pEntry",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d85,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                   );
    }
    iVar3 = (*pBVar2->_vptr_BlockEntry[3])(pBVar2);
    if (iVar3 == 0) break;
    iVar3 = (*pBVar2->_vptr_BlockEntry[2])(pBVar2);
    pBVar5 = (Block *)CONCAT44(extraout_var_00,iVar3);
    if (pBVar5 == (Block *)0x0) {
      __assert_fail("pBlock",
                    "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                    ,0x1d89,
                    "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                   );
    }
    if ((pBVar5->m_track == tp->m_track) &&
       (lVar6 = Block::GetTimeCode(pBVar5,this), lVar1 <= lVar6)) {
      if (lVar6 <= lVar1) {
        this_00 = this->m_pSegment->m_pTracks;
        if (this_00 == (Tracks *)0x0) {
          __assert_fail("pTracks",
                        "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                        ,0x1d9b,
                        "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
                       );
        }
        pTVar8 = Tracks::GetTrackByNumber(this_00,tp->m_track);
        if (pTVar8 != (Track *)0x0) {
          lVar1 = (pTVar8->m_info).type;
          if (lVar1 == 1) {
            if (-1 < (char)pBVar5->m_flags) {
              return (BlockEntry *)0x0;
            }
            return pBVar2;
          }
          if (lVar1 == 2) {
            return pBVar2;
          }
        }
      }
      return (BlockEntry *)0x0;
    }
    lVar9 = lVar9 + 1;
  }
  __assert_fail("!pEntry->EOS()",
                "/workspace/llm4binary/github/license_c_cmakelists/webmproject[P]libwebm/mkvparser/mkvparser.cc"
                ,0x1d86,
                "const BlockEntry *mkvparser::Cluster::GetEntry(const CuePoint &, const CuePoint::TrackPosition &) const"
               );
}

Assistant:

const BlockEntry* Cluster::GetEntry(const CuePoint& cp,
                                    const CuePoint::TrackPosition& tp) const {
  assert(m_pSegment);
  const long long tc = cp.GetTimeCode();

  if (tp.m_block > 0) {
    const long block = static_cast<long>(tp.m_block);
    const long index = block - 1;

    while (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if ((pBlock->GetTrackNumber() == tp.m_track) &&
        (pBlock->GetTimeCode(this) == tc)) {
      return pEntry;
    }
  }

  long index = 0;

  for (;;) {
    if (index >= m_entries_count) {
      long long pos;
      long len;

      const long status = Parse(pos, len);

      if (status < 0)  // TODO: can this happen?
        return NULL;

      if (status > 0)  // nothing remains to be parsed
        return NULL;

      assert(m_entries);
      assert(index < m_entries_count);
    }

    const BlockEntry* const pEntry = m_entries[index];
    assert(pEntry);
    assert(!pEntry->EOS());

    const Block* const pBlock = pEntry->GetBlock();
    assert(pBlock);

    if (pBlock->GetTrackNumber() != tp.m_track) {
      ++index;
      continue;
    }

    const long long tc_ = pBlock->GetTimeCode(this);

    if (tc_ < tc) {
      ++index;
      continue;
    }

    if (tc_ > tc)
      return NULL;

    const Tracks* const pTracks = m_pSegment->GetTracks();
    assert(pTracks);

    const long tn = static_cast<long>(tp.m_track);
    const Track* const pTrack = pTracks->GetTrackByNumber(tn);

    if (pTrack == NULL)
      return NULL;

    const long long type = pTrack->GetType();

    if (type == 2)  // audio
      return pEntry;

    if (type != 1)  // not video
      return NULL;

    if (!pBlock->IsKey())
      return NULL;

    return pEntry;
  }
}